

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::BP5Writer::BP5Writer(BP5Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  Comm *comm_00;
  TimePoint TVar1;
  int iVar2;
  ScopedTimer __var243;
  ScopedTimer local_b8;
  Comm local_b0 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  FileDrainerSingleThread *local_88;
  TransportMan *local_80;
  TransportMan *local_78;
  TransportMan *local_70;
  TransportMan *local_68;
  BP5Serializer *local_60;
  BP5Engine *local_58;
  string local_50;
  
  BP5Engine::BP5Engine(&this->super_BP5Engine);
  local_58 = &this->super_BP5Engine;
  std::__cxx11::string::string((string *)&local_50,"BP5Writer",(allocator *)&local_b8);
  helper::Comm::Comm(local_b0,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,local_b0);
  helper::Comm::~Comm(local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP5Writer_0081dd68;
  adios2::format::BP5Serializer::BP5Serializer(&this->m_BP5Serializer);
  comm_00 = &(this->super_Engine).m_Comm;
  local_60 = &this->m_BP5Serializer;
  transportman::TransportMan::TransportMan(&this->m_FileDataManager,io,comm_00);
  local_70 = &this->m_FileMetadataManager;
  local_68 = &this->m_FileDataManager;
  transportman::TransportMan::TransportMan(local_70,io,comm_00);
  local_78 = &this->m_FileMetadataIndexManager;
  transportman::TransportMan::TransportMan(local_78,io,comm_00);
  local_80 = &this->m_FileMetaMetadataManager;
  transportman::TransportMan::TransportMan(local_80,io,comm_00);
  this->m_WriterStep = 0;
  this->m_IsFirstStep = true;
  this->m_WriteToBB = false;
  this->m_DrainBB = true;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread(&this->m_FileDrainer);
  (this->m_BBName)._M_dataplus._M_p = (pointer)&(this->m_BBName).field_2;
  (this->m_BBName)._M_string_length = 0;
  (this->m_BBName).field_2._M_local_buf[0] = '\0';
  local_90 = &this->m_SubStreamNames;
  memset(local_90,0,0xc0);
  local_88 = &this->m_FileDrainer;
  aggregator::MPIShmChain::MPIShmChain(&this->m_AggregatorTwoLevelShm);
  aggregator::MPIChain::MPIChain(&this->m_AggregatorEveroneWrites);
  this->m_IAmDraining = false;
  this->m_IAmWritingData = false;
  helper::Comm::Comm(&this->m_CommAggregators);
  aggregator::MPIChain::MPIChain(&this->m_AggregatorMetadata);
  helper::Comm::Comm(&this->m_CommMetadataAggregators);
  profiling::JSONProfiler::JSONProfiler(&this->m_Profiler,comm_00);
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_DataPos = 0;
  this->m_ThisTimestepDataSize = 0;
  this->m_MetaDataPos = 0;
  this->m_StartDataPos = 0;
  (this->m_WriterDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_MarshalAttributesNecessary = true;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_WriteFuture).super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_InComputationBlock = false;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FlushPosSizeInfo).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_WriterSubfileMap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_AppendDataPos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_LastTimeBetweenSteps).__r = 0.0;
  (this->m_TotalTimeBetweenSteps).__r = 0.0;
  (this->m_AvgTimeBetweenSteps).__r = 0.0;
  (this->m_ExpectedTimeBetweenSteps).__r = 0.0;
  (this->m_BeginStepStart).__d.__r = 0.0;
  (this->m_EndStepEnd).__d.__r = 0.0;
  (this->m_EngineStart).__d.__r = 0.0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ComputationBlocksLength = 0.0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ComputationBlockTimes).
  super__Vector_base<adios2::core::engine::BP5Writer::ComputationBlockInfo,_std::allocator<adios2::core::engine::BP5Writer::ComputationBlockInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ComputationBlockStart).__d.__r = 0.0;
  this->m_ComputationBlockID = 0;
  shm::Spinlock::Spinlock(&this->m_AsyncWriteLock);
  TVar1 = Now();
  (this->m_EngineStart).__d.__r = (rep_conflict)TVar1.__d.__r;
  if (BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var43 == '\0') {
    iVar2 = __cxa_guard_acquire(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var43);
    if (iVar2 != 0) {
      BP5Writer::__var43 = (void *)ps_timer_create_("BP5Writer::Open");
      __cxa_guard_release(&BP5Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var43);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_b8,BP5Writer::__var43);
  ((this->super_Engine).m_IO)->m_ReadStreaming = false;
  Init(this);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_b8);
  return;
}

Assistant:

BP5Writer::BP5Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP5Writer", io, name, mode, std::move(comm)), m_BP5Serializer(),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileMetaMetadataManager(io, m_Comm), m_Profiler(m_Comm)
{
    m_EngineStart = Now();
    PERFSTUBS_SCOPED_TIMER("BP5Writer::Open");
    m_IO.m_ReadStreaming = false;

    Init();
    m_IsOpen = true;
}